

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001973f0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001973f7._0_1_ = '-';
    uRam00000000001973f7._1_1_ = '-';
    uRam00000000001973f7._2_1_ = '-';
    uRam00000000001973f7._3_1_ = '-';
    uRam00000000001973f7._4_1_ = '-';
    uRam00000000001973f7._5_1_ = '-';
    uRam00000000001973f7._6_1_ = '-';
    uRam00000000001973f7._7_1_ = '-';
    DAT_001973e0 = '-';
    DAT_001973e0_1._0_1_ = '-';
    DAT_001973e0_1._1_1_ = '-';
    DAT_001973e0_1._2_1_ = '-';
    DAT_001973e0_1._3_1_ = '-';
    DAT_001973e0_1._4_1_ = '-';
    DAT_001973e0_1._5_1_ = '-';
    DAT_001973e0_1._6_1_ = '-';
    uRam00000000001973e8 = 0x2d2d2d2d2d2d2d;
    DAT_001973ef = 0x2d;
    DAT_001973d0 = '-';
    DAT_001973d0_1._0_1_ = '-';
    DAT_001973d0_1._1_1_ = '-';
    DAT_001973d0_1._2_1_ = '-';
    DAT_001973d0_1._3_1_ = '-';
    DAT_001973d0_1._4_1_ = '-';
    DAT_001973d0_1._5_1_ = '-';
    DAT_001973d0_1._6_1_ = '-';
    uRam00000000001973d8._0_1_ = '-';
    uRam00000000001973d8._1_1_ = '-';
    uRam00000000001973d8._2_1_ = '-';
    uRam00000000001973d8._3_1_ = '-';
    uRam00000000001973d8._4_1_ = '-';
    uRam00000000001973d8._5_1_ = '-';
    uRam00000000001973d8._6_1_ = '-';
    uRam00000000001973d8._7_1_ = '-';
    DAT_001973c0 = '-';
    DAT_001973c0_1._0_1_ = '-';
    DAT_001973c0_1._1_1_ = '-';
    DAT_001973c0_1._2_1_ = '-';
    DAT_001973c0_1._3_1_ = '-';
    DAT_001973c0_1._4_1_ = '-';
    DAT_001973c0_1._5_1_ = '-';
    DAT_001973c0_1._6_1_ = '-';
    uRam00000000001973c8._0_1_ = '-';
    uRam00000000001973c8._1_1_ = '-';
    uRam00000000001973c8._2_1_ = '-';
    uRam00000000001973c8._3_1_ = '-';
    uRam00000000001973c8._4_1_ = '-';
    uRam00000000001973c8._5_1_ = '-';
    uRam00000000001973c8._6_1_ = '-';
    uRam00000000001973c8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001973b8._0_1_ = '-';
    uRam00000000001973b8._1_1_ = '-';
    uRam00000000001973b8._2_1_ = '-';
    uRam00000000001973b8._3_1_ = '-';
    uRam00000000001973b8._4_1_ = '-';
    uRam00000000001973b8._5_1_ = '-';
    uRam00000000001973b8._6_1_ = '-';
    uRam00000000001973b8._7_1_ = '-';
    DAT_001973ff = 0;
  }
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}